

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ProgramInterfaceDefinition::Program::~Program(Program *this)

{
  StructType *this_00;
  Shader *this_01;
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference ppSVar4;
  reference pvVar5;
  reference pvVar6;
  reference ppSVar7;
  int local_64;
  iterator iStack_60;
  int shaderNdx_1;
  _Self local_58;
  iterator it;
  int varNdx_1;
  int interfaceNdx;
  int varNdx;
  int shaderNdx;
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  structTypes;
  Program *this_local;
  
  structTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::set((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
         *)&varNdx);
  interfaceNdx = 0;
  while( true ) {
    sVar3 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ::size(&this->m_shaders);
    if ((int)sVar3 <= interfaceNdx) break;
    varNdx_1 = 0;
    while( true ) {
      ppSVar4 = std::
                vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ::operator[](&this->m_shaders,(long)interfaceNdx);
      sVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                        (&((*ppSVar4)->m_defaultBlock).variables);
      if ((int)sVar3 <= varNdx_1) break;
      ppSVar4 = std::
                vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ::operator[](&this->m_shaders,(long)interfaceNdx);
      pvVar5 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&((*ppSVar4)->m_defaultBlock).variables,(long)varNdx_1);
      collectStructPtrs((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                         *)&varNdx,&pvVar5->varType);
      varNdx_1 = varNdx_1 + 1;
    }
    it._M_node._4_4_ = 0;
    while( true ) {
      iVar1 = it._M_node._4_4_;
      ppSVar4 = std::
                vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ::operator[](&this->m_shaders,(long)interfaceNdx);
      sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                        (&((*ppSVar4)->m_defaultBlock).interfaceBlocks);
      if ((int)sVar3 <= iVar1) break;
      it._M_node._0_4_ = 0;
      while( true ) {
        iVar1 = (int)it._M_node;
        ppSVar4 = std::
                  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                  ::operator[](&this->m_shaders,(long)interfaceNdx);
        pvVar6 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                           (&((*ppSVar4)->m_defaultBlock).interfaceBlocks,(long)it._M_node._4_4_);
        sVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                size(&pvVar6->variables);
        if ((int)sVar3 <= iVar1) break;
        ppSVar4 = std::
                  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                  ::operator[](&this->m_shaders,(long)interfaceNdx);
        pvVar6 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                           (&((*ppSVar4)->m_defaultBlock).interfaceBlocks,(long)it._M_node._4_4_);
        pvVar5 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                 operator[](&pvVar6->variables,(long)(int)it._M_node);
        collectStructPtrs((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                           *)&varNdx,&pvVar5->varType);
        it._M_node._0_4_ = (int)it._M_node + 1;
      }
      it._M_node._4_4_ = it._M_node._4_4_ + 1;
    }
    interfaceNdx = interfaceNdx + 1;
  }
  local_58._M_node =
       (_Base_ptr)
       std::
       set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
       ::begin((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                *)&varNdx);
  while( true ) {
    iStack_60 = std::
                set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                ::end((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                       *)&varNdx);
    bVar2 = std::operator!=(&local_58,&stack0xffffffffffffffa0);
    if (!bVar2) break;
    ppSVar7 = std::_Rb_tree_const_iterator<const_glu::StructType_*>::operator*(&local_58);
    this_00 = *ppSVar7;
    if (this_00 != (StructType *)0x0) {
      glu::StructType::~StructType(this_00);
      operator_delete(this_00,0x38);
    }
    std::_Rb_tree_const_iterator<const_glu::StructType_*>::operator++(&local_58);
  }
  std::
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::~set((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
          *)&varNdx);
  local_64 = 0;
  while( true ) {
    sVar3 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ::size(&this->m_shaders);
    if ((int)sVar3 <= local_64) break;
    ppSVar4 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](&this->m_shaders,(long)local_64);
    this_01 = *ppSVar4;
    if (this_01 != (Shader *)0x0) {
      ProgramInterfaceDefinition::Shader::~Shader(this_01);
      operator_delete(this_01,0x38);
    }
    local_64 = local_64 + 1;
  }
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  ::clear(&this->m_shaders);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_xfbVaryings);
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  ::~vector(&this->m_shaders);
  return;
}

Assistant:

Program::~Program (void)
{
	// delete shader struct types, need to be done by the program since shaders might share struct types
	{
		std::set<const glu::StructType*> structTypes;

		for (int shaderNdx = 0; shaderNdx < (int)m_shaders.size(); ++shaderNdx)
		{
			for (int varNdx = 0; varNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.variables.size(); ++varNdx)
				collectStructPtrs(structTypes, m_shaders[shaderNdx]->m_defaultBlock.variables[varNdx].varType);

			for (int interfaceNdx = 0; interfaceNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
				for (int varNdx = 0; varNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks[interfaceNdx].variables.size(); ++varNdx)
					collectStructPtrs(structTypes, m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks[interfaceNdx].variables[varNdx].varType);
		}

		for (std::set<const glu::StructType*>::iterator it = structTypes.begin(); it != structTypes.end(); ++it)
			delete *it;
	}

	for (int shaderNdx = 0; shaderNdx < (int)m_shaders.size(); ++shaderNdx)
		delete m_shaders[shaderNdx];
	m_shaders.clear();
}